

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_printer.c
# Opt level: O3

void print_symbol_list(TextBuffer *buf,LuaSymbolList *list,int level,char *delimiter)

{
  byte bVar1;
  LuaSymbol *sym;
  PtrListIterator nodeiter__;
  PtrListIterator PStack_48;
  
  raviX_ptrlist_forward_iterator(&PStack_48,(PtrList *)list);
  sym = (LuaSymbol *)raviX_ptrlist_iter_next(&PStack_48);
  if (sym != (LuaSymbol *)0x0) {
    bVar1 = 1;
    do {
      if (!(bool)(delimiter == (char *)0x0 | bVar1)) {
        printf_buf(buf,"%p%s\n",(ulong)(uint)level,delimiter);
      }
      print_symbol(buf,sym,level + 1);
      sym = (LuaSymbol *)raviX_ptrlist_iter_next(&PStack_48);
      bVar1 = 0;
    } while (sym != (LuaSymbol *)0x0);
  }
  return;
}

Assistant:

static void print_symbol_list(TextBuffer *buf, LuaSymbolList *list, int level, const char *delimiter)
{
	LuaSymbol *node;
	bool is_first = true;
	FOR_EACH_PTR(list, LuaSymbol, node)
	{
		if (is_first)
			is_first = false;
		else if (delimiter)
			printf_buf(buf, "%p%s\n", level, delimiter);
		print_symbol(buf, node, level + 1);
	}
	END_FOR_EACH_PTR(node);
}